

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O0

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingHalfOpaquePixelIsBlended
          (GenericRGBXBlenderTests *this)

{
  uint8_t *covers;
  color color_;
  allocator local_1b1;
  string local_1b0 [32];
  LocationInfo local_190;
  allocator local_161;
  string local_160 [32];
  LocationInfo local_140;
  allocator local_111;
  string local_110 [32];
  LocationInfo local_f0;
  allocator local_b1;
  string local_b0 [32];
  LocationInfo local_90;
  pixel_rgbx<agge::order_abgr> local_64;
  pixel_rgbx<agge::order_argb> local_60;
  pixel4 reference4;
  pixel3 reference3;
  pixel2 reference2;
  pixel1 reference1;
  pixel4 dest4;
  pixel3 dest3;
  pixel2 dest2;
  pixel1 dest1;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,_agge::order_abgr> b4;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb> b3;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra> b2;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba> b1;
  uint8_t cover;
  GenericRGBXBlenderTests *this_local;
  
  b1._color.a = 0xa0;
  unique0x100004f0 = this;
  b2._color = color::make('\x10',' ','0',0xff);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  blender_solid_color_rgb
            ((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
              *)&b2._a,b2._color);
  b3._color = color::make('\x10',' ','0',0xff);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>::
  blender_solid_color_rgb
            ((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>
              *)&b3._a,b3._color);
  b4._color = color::make('\x10',' ','0',0xff);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>::
  blender_solid_color_rgb
            ((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>
              *)&b4._a,b4._color);
  color_ = color::make('\x10',' ','0',0xff);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,_agge::order_abgr>::
  blender_solid_color_rgb
            ((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,_agge::order_abgr>
              *)&dest1,color_);
  dest3.components[0] = '%';
  dest3.components[1] = 'G';
  dest3.components[2] = 0x9a;
  dest3.components[3] = 0xab;
  dest4.components[0] = '%';
  dest4.components[1] = 'G';
  dest4.components[2] = 0x9a;
  dest4.components[3] = 0xab;
  reference1.components[0] = '%';
  reference1.components[1] = 'G';
  reference1.components[2] = 0x9a;
  reference1.components[3] = 0xab;
  reference2.components[0] = '%';
  reference2.components[1] = 'G';
  reference2.components[2] = 0x9a;
  reference2.components[3] = 0xab;
  covers = &b1._color.a;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
              *)&b2._a,(pixel *)&dest3,0,0,1,covers);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>::
  operator()((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,_agge::order_bgra>
              *)&b3._a,(pixel *)&dest4,0,0,1,covers);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>::
  operator()((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_argb>,_agge::order_argb>
              *)&b4._a,(pixel *)&reference1,0,0,1,covers);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,_agge::order_abgr>::
  operator()((blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,_agge::order_abgr>
              *)&dest1,(pixel *)&reference2,0,0,1,covers);
  builtin_memcpy(reference3.components,"\x17.W",4);
  builtin_memcpy(reference4.components,"+.C",4);
  local_60.components[0] = '\0';
  local_60.components[1] = '$';
  local_60.components[2] = 'M';
  local_60.components[3] = ']';
  local_64.components[0] = '\0';
  local_64.components[1] = '8';
  local_64.components[2] = 'M';
  local_64.components[3] = 'I';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_b1);
  ut::LocationInfo::LocationInfo(&local_90,(string *)local_b0,0xaa);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>>
            ((pixel_rgbx<agge::order_rgba> *)&reference3,(pixel_rgbx<agge::order_rgba> *)&dest3,
             &local_90);
  ut::LocationInfo::~LocationInfo(&local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_111);
  ut::LocationInfo::LocationInfo(&local_f0,(string *)local_110,0xab);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,agge::tests::mocks::pixel_rgbx<agge::order_bgra>>
            ((pixel_rgbx<agge::order_bgra> *)&reference4,(pixel_rgbx<agge::order_bgra> *)&dest4,
             &local_f0);
  ut::LocationInfo::~LocationInfo(&local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_161);
  ut::LocationInfo::LocationInfo(&local_140,(string *)local_160,0xac);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_argb>,agge::tests::mocks::pixel_rgbx<agge::order_argb>>
            (&local_60,(pixel_rgbx<agge::order_argb> *)&reference1,&local_140);
  ut::LocationInfo::~LocationInfo(&local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_1b1);
  ut::LocationInfo::LocationInfo(&local_190,(string *)local_1b0,0xad);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_abgr>,agge::tests::mocks::pixel_rgbx<agge::order_abgr>>
            (&local_64,(pixel_rgbx<agge::order_abgr> *)&reference2,&local_190);
  ut::LocationInfo::~LocationInfo(&local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  return;
}

Assistant:

test( BlendingHalfOpaquePixelIsBlended )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel1;
				typedef mocks::pixel_rgbx<order_bgra> pixel2;
				typedef mocks::pixel_rgbx<order_argb> pixel3;
				typedef mocks::pixel_rgbx<order_abgr> pixel4;

				// INIT
				const uint8_t cover = 0xA0;
				blender_solid_color_rgb<pixel1, order_rgba> b1(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel2, order_bgra> b2(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel3, order_argb> b3(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel4, order_abgr> b4(color::make(0x10, 0x20, 0x30));
				pixel1 dest1 = { { 0x25, 0x47, 0x9A, 0xAB } };
				pixel2 dest2 = { { 0x25, 0x47, 0x9A, 0xAB } };
				pixel3 dest3 = { { 0x25, 0x47, 0x9A, 0xAB } };
				pixel4 dest4 = { { 0x25, 0x47, 0x9A, 0xAB } };

				// ACT
				b1(&dest1, 0, 0, 1, &cover);
				b2(&dest2, 0, 0, 1, &cover);
				b3(&dest3, 0, 0, 1, &cover);
				b4(&dest4, 0, 0, 1, &cover);

				// ASSERT
				pixel1 reference1 = { { 0x17, 0x2E, 0x57 } };
				pixel2 reference2 = { { 0x2B, 0x2E, 0x43 } };
				pixel3 reference3 = { { 0, 0x24, 0x4D, 0x5D } };
				pixel4 reference4 = { { 0, 0x38, 0x4D, 0x49 } };

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
				assert_equal(reference3, dest3);
				assert_equal(reference4, dest4);
			}